

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTags(Config *config)

{
  size_type *psVar1;
  pointer *__return_storage_ptr__;
  pointer pbVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar4;
  undefined4 extraout_var_01;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  iterator iVar5;
  TextAttributes *pTVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  pointer pbVar10;
  pointer *ppbVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar12;
  undefined1 local_2d8 [8];
  ostringstream oss;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [24];
  _Base_ptr p_Stack_298;
  undefined1 local_290 [16];
  pointer local_280;
  pointer pFStack_278;
  TagAliasRegistry *local_270;
  ios_base local_268 [264];
  undefined1 local_160 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  long *local_110;
  long local_100 [2];
  pointer local_f0;
  pointer local_e8;
  undefined1 auStack_e0 [8];
  TestSpec testSpec;
  string lcaseTagName;
  Text wrapper;
  string tagName;
  
  iVar3 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)auStack_e0
             ,(vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
              CONCAT44(extraout_var,iVar3));
  iVar3 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar3) == ((long *)CONCAT44(extraout_var_00,iVar3))[1]) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All available tags:\n",0x14);
    TagAliasRegistry::get();
    local_2b8 = (undefined1  [8])0x0;
    local_2b0._0_4_ = local_2b0._0_4_ & 0xffffff00;
    local_2b0._16_8_ = (_Base_ptr)0x0;
    p_Stack_298 = (_Base_ptr)0x0;
    local_290._0_8_ = (pointer)0x0;
    local_290._8_8_ = (pointer)0x0;
    local_280 = (pointer)0x0;
    pFStack_278 = (pointer)0x0;
    local_270 = &TagAliasRegistry::get::instance;
    psVar1 = &wrapper.str._M_string_length;
    local_2c8._8_8_ = local_2b0;
    lcaseTagName.field_2._8_8_ = psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&lcaseTagName.field_2 + 8),"*","");
    this = TestSpecParser::parse
                     ((TestSpecParser *)local_2d8,(string *)((long)&lcaseTagName.field_2 + 8));
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &wrapper.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&(this->m_testSpec).m_filters);
    tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         testSpec.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    tagCounts._M_t._M_impl._0_8_ =
         testSpec.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)auStack_e0;
    auStack_e0 = (undefined1  [8])
                 wrapper.lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)tagName._M_dataplus._M_p;
    testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)tagName._M_string_length;
    wrapper.lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tagName._M_dataplus._M_p = (pointer)0x0;
    tagName._M_string_length = 0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &wrapper.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((size_type *)lcaseTagName.field_2._8_8_ != psVar1) {
      operator_delete((void *)lcaseTagName.field_2._8_8_,wrapper.str._M_string_length + 1);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               (local_290 + 8));
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)(local_2b0 + 0x10));
    if ((undefined1 *)local_2c8._8_8_ != local_2b0) {
      operator_delete((void *)local_2c8._8_8_,CONCAT44(local_2b0._4_4_,local_2b0._0_4_) + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tags for matching test cases:\n",0x1e);
  }
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tagCounts;
  tagCounts._M_t._M_impl._0_8_ = tagCounts._M_t._M_impl._0_8_ & 0xffffffff00000000;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[3])(pIVar4);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x18))
                        ((long *)CONCAT44(extraout_var_01,iVar3),config);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_160,testCases,
              (TestSpec *)auStack_e0,(IConfig *)config);
  local_e8 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (local_160 !=
      (undefined1  [8])
      matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
      .super__Vector_impl_data._M_start) {
    ppbVar11 = &wrapper.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__ =
         &testSpec.m_filters.
          super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_f0 = (pointer)local_160;
      for (p_Var7 = (((pointer)local_160)->super_TestCaseInfo).tags._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 !=
          &(((pointer)local_160)->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        wrapper.lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&tagName._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)ppbVar11,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        toLower((string *)__return_storage_ptr__,(string *)ppbVar11);
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                        *)&matchedTestCases.
                           super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (key_type *)__return_storage_ptr__);
        if (iVar5._M_node == (_Base_ptr)&tagCounts) {
          wrapper.str._M_dataplus._M_p._0_4_ = 0;
          wrapper.str._M_string_length = 0;
          wrapper.str.field_2._M_allocated_capacity = (size_type)&wrapper;
          wrapper.attr.initialIndent = 0;
          wrapper.attr.indent = 0;
          local_2d8 = (undefined1  [8])local_2c8;
          wrapper.str.field_2._8_8_ = wrapper.str.field_2._M_allocated_capacity;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2d8,
                     testSpec.m_filters.
                     super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     lcaseTagName._M_dataplus._M_p +
                     (long)testSpec.m_filters.
                           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (wrapper.str._M_string_length == 0) {
            local_2b0._0_4_ = 0;
            local_2b0._8_8_ = 0;
            local_2b0._16_8_ = local_2b0;
            pTVar6 = (TextAttributes *)local_290;
            p_Stack_298 = (_Base_ptr)local_2b0._16_8_;
          }
          else {
            local_2b0._0_4_ = (uint)wrapper.str._M_dataplus._M_p;
            local_2b0._8_8_ = wrapper.str._M_string_length;
            local_2b0._16_8_ = wrapper.str.field_2._M_allocated_capacity;
            p_Stack_298 = (_Base_ptr)wrapper.str.field_2._8_8_;
            *(undefined1 **)(wrapper.str._M_string_length + 8) = local_2b0;
            local_290._0_8_ = wrapper.attr.initialIndent;
            wrapper.str._M_string_length = 0;
            wrapper.str.field_2._M_allocated_capacity = (size_type)&wrapper;
            pTVar6 = &wrapper.attr;
            wrapper.str.field_2._8_8_ = wrapper.str.field_2._M_allocated_capacity;
          }
          pTVar6->initialIndent = 0;
          local_290._8_8_ = wrapper.attr.indent;
          pVar12 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                   ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagInfo>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                               *)&matchedTestCases.
                                  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                               *)local_2d8);
          iVar5._M_node = (_Base_ptr)pVar12.first._M_node;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2b8);
          if (local_2d8 != (undefined1  [8])local_2c8) {
            operator_delete((void *)local_2d8,local_2c8._0_8_ + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&lcaseTagName.field_2 + 8));
        }
        iVar5._M_node[3]._M_left = (_Base_ptr)((long)&(iVar5._M_node[3]._M_left)->_M_color + 1);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(iVar5._M_node + 2),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar11);
        if (testSpec.m_filters.
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage !=
            (pointer)&lcaseTagName._M_string_length) {
          operator_delete(testSpec.m_filters.
                          super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          lcaseTagName._M_string_length + 1);
        }
        if (wrapper.lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&tagName._M_string_length
           ) {
          operator_delete(wrapper.lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          tagName._M_string_length + 1);
        }
      }
      local_160 = (undefined1  [8])(local_f0 + 1);
    } while (local_160 != (undefined1  [8])local_e8);
  }
  if (tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&tagCounts) {
    p_Var9 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      ppbVar11 = &wrapper.lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"  ",2);
      *(undefined8 *)(local_2c8 + *(long *)((long)local_2d8 + -0x18)) = 2;
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_2d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
      TagInfo::all_abi_cxx11_((string *)ppbVar11,(TagInfo *)(p_Var9 + 2));
      lcaseTagName._M_string_length = 0x4f;
      lcaseTagName.field_2._M_local_buf[0] = '\t';
      testSpec.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lcaseTagName._M_dataplus._M_p = (pointer)0x0;
      std::__cxx11::stringbuf::str();
      lcaseTagName._M_string_length = 0x46;
      Tbc::Text::Text((Text *)((long)&lcaseTagName.field_2 + 8),(string *)ppbVar11,
                      (TextAttributes *)
                      &testSpec.m_filters.
                       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      if (wrapper.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&tagName._M_string_length)
      {
        operator_delete(wrapper.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        tagName._M_string_length + 1);
      }
      std::__cxx11::stringbuf::str();
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          (char *)wrapper.lines.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)tagName._M_dataplus._M_p);
      pbVar2 = wrapper.lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pbVar10 = (pointer)wrapper.attr._24_8_; pbVar10 != pbVar2; pbVar10 = pbVar10 + 1) {
        if (pbVar10 != (pointer)wrapper.attr._24_8_) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      if (wrapper.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&tagName._M_string_length)
      {
        operator_delete(wrapper.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        tagName._M_string_length + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&wrapper.attr.tabChar);
      if ((size_type *)lcaseTagName.field_2._8_8_ != &wrapper.str._M_string_length) {
        operator_delete((void *)lcaseTagName.field_2._8_8_,wrapper.str._M_string_length + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
      std::ios_base::~ios_base(local_268);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != (_Rb_tree_node_base *)&tagCounts);
  }
  p_Var9 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  psVar1 = &wrapper.str._M_string_length;
  lcaseTagName.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&lcaseTagName.field_2 + 8),"tag","");
  local_2d8 = (undefined1  [8])p_Var9;
  _oss = local_2c8 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&oss,lcaseTagName.field_2._8_8_,
             CONCAT44(wrapper.str._M_dataplus._M_p._4_4_,(uint)wrapper.str._M_dataplus._M_p) +
             lcaseTagName.field_2._8_8_);
  operator<<((ostream *)&std::cout,(pluralise *)local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  if (_oss != local_2c8 + 8) {
    operator_delete(_oss,(ulong)(local_2c8._8_8_ + 1));
  }
  if ((size_type *)lcaseTagName.field_2._8_8_ != psVar1) {
    operator_delete((void *)lcaseTagName.field_2._8_8_,wrapper.str._M_string_length + 1);
  }
  p_Var9 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_160);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
               *)&matchedTestCases.
                  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)auStack_e0
            );
  return (size_t)p_Var9;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }